

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_constructor.c
# Opt level: O2

void constructor_set(constructor ctor,size_t index,char *name,type t)

{
  int iVar1;
  size_t sVar2;
  set __dest;
  size_t line;
  char *message;
  constructor value;
  
  if (((ctor != (constructor)0x0) && (name != (char *)0x0)) && (index < ctor->count)) {
    sVar2 = strlen(name);
    __dest = (set)malloc(sVar2 + 1);
    if (__dest == (set)0x0) {
      message = "Invalid constructor name allocation";
      line = 0xb3;
    }
    else {
      value = ctor + index + 1;
      free(ctor[index + 1].map);
      ctor[index + 1].map = __dest;
      memcpy(__dest,name,sVar2 + 1);
      ctor[index + 1].count = (size_t)t;
      *(size_t *)value = index;
      iVar1 = set_insert(ctor->map,__dest,value);
      if (iVar1 == 0) {
        return;
      }
      free(ctor[index + 1].map);
      *(size_t *)value = 0xffffffffffffffff;
      ctor[index + 1].map = (set)0x0;
      ctor[index + 1].count = 0;
      message = "Invalid constructor set insertion";
      line = 0xcd;
    }
    log_write_impl_va("metacall",line,"constructor_set",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_constructor.c"
                      ,LOG_LEVEL_ERROR,message);
    return;
  }
  return;
}

Assistant:

void constructor_set(constructor ctor, size_t index, const char *name, type t)
{
	if (ctor != NULL && index < ctor->count && name != NULL)
	{
		constructor_node node = constructor_at(ctor, index);

		size_t name_size = strlen(name) + 1;

		char *name_node = malloc(sizeof(char) * name_size);

		if (name_node == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid constructor name allocation");

			return;
		}

		if (node->name != NULL)
		{
			free(node->name);
		}

		node->name = name_node;

		memcpy(node->name, name, name_size);

		node->t = t;

		node->index = index;

		if (set_insert(ctor->map, (set_key)node->name, (set_value)node) != 0)
		{
			free(node->name);

			node->index = REFLECT_CONSTRUCTOR_INVALID_INDEX;
			node->name = NULL;
			node->t = NULL;

			log_write("metacall", LOG_LEVEL_ERROR, "Invalid constructor set insertion");
		}
	}
}